

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall
pbrt::RealisticCamera::ComputeThickLensApproximation(RealisticCamera *this,Float *pz,Float *fz)

{
  size_t sVar1;
  float fVar2;
  long lVar3;
  Float FVar4;
  Ray local_70;
  Ray local_48;
  
  sVar1 = (this->elementInterfaces).nStored;
  fVar2 = *(float *)(((this->super_CameraBase).film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff) +
                    0x20) * 0.001;
  if (sVar1 == 0) {
    local_70.o.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  }
  else {
    local_70.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    lVar3 = 0;
    do {
      local_70.o.super_Tuple3<pbrt::Point3,_float>.z =
           local_70.o.super_Tuple3<pbrt::Point3,_float>.z +
           *(float *)((long)&((this->elementInterfaces).ptr)->thickness + lVar3);
      lVar3 = lVar3 + 0x10;
    } while (sVar1 << 4 != lVar3);
    local_70.o.super_Tuple3<pbrt::Point3,_float>.z =
         local_70.o.super_Tuple3<pbrt::Point3,_float>.z + 1.0;
  }
  local_70.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_48.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_70.d.super_Tuple3<pbrt::Vector3,_float>.z = -1.0;
  local_70.time = 0.0;
  local_48.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_70.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_48.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_48.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_48.time = 0.0;
  local_70.o.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
  local_48.d.super_Tuple3<pbrt::Vector3,_float>.x = local_48.o.super_Tuple3<pbrt::Point3,_float>.x;
  local_48.d.super_Tuple3<pbrt::Vector3,_float>.y = local_48.o.super_Tuple3<pbrt::Point3,_float>.y;
  local_48.d.super_Tuple3<pbrt::Vector3,_float>.z = local_48.o.super_Tuple3<pbrt::Point3,_float>.z;
  FVar4 = TraceLensesFromScene(this,&local_70,&local_48);
  if ((FVar4 == 0.0) && (!NAN(FVar4))) {
    ErrorExit<>(
               "Unable to trace ray from scene to film for thick lens approximation. Is aperture stop extremely small?"
               );
  }
  *fz = -(local_48.o.super_Tuple3<pbrt::Point3,_float>.z -
         local_48.d.super_Tuple3<pbrt::Vector3,_float>.z *
         (local_48.o.super_Tuple3<pbrt::Point3,_float>.x /
         local_48.d.super_Tuple3<pbrt::Vector3,_float>.x));
  *pz = -(local_48.o.super_Tuple3<pbrt::Point3,_float>.z +
         local_48.d.super_Tuple3<pbrt::Vector3,_float>.z *
         ((fVar2 - local_48.o.super_Tuple3<pbrt::Point3,_float>.x) /
         local_48.d.super_Tuple3<pbrt::Vector3,_float>.x));
  local_48.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_48.o.super_Tuple3<pbrt::Point3,_float>.z =
       (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness + -1.0;
  local_48.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_48.d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_48.d.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  local_48.time = 0.0;
  local_48.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_48.o.super_Tuple3<pbrt::Point3,_float>.x = fVar2;
  FVar4 = TraceLensesFromFilm(this,&local_48,&local_70);
  if ((FVar4 == 0.0) && (!NAN(FVar4))) {
    ErrorExit<>(
               "Unable to trace ray from film to scene for thick lens approximation. Is aperture stop extremely small?"
               );
  }
  fz[1] = -(local_70.o.super_Tuple3<pbrt::Point3,_float>.z -
           local_70.d.super_Tuple3<pbrt::Vector3,_float>.z *
           (local_70.o.super_Tuple3<pbrt::Point3,_float>.x /
           local_70.d.super_Tuple3<pbrt::Vector3,_float>.x));
  pz[1] = -(local_70.o.super_Tuple3<pbrt::Point3,_float>.z +
           local_70.d.super_Tuple3<pbrt::Vector3,_float>.z *
           ((local_48.o.super_Tuple3<pbrt::Point3,_float>.x -
            local_70.o.super_Tuple3<pbrt::Point3,_float>.x) /
           local_70.d.super_Tuple3<pbrt::Vector3,_float>.x));
  return;
}

Assistant:

void RealisticCamera::ComputeThickLensApproximation(Float pz[2], Float fz[2]) const {
    // Find height $x$ from optical axis for parallel rays
    Float x = .001f * film.Diagonal();

    // Compute cardinal points for film side of lens system
    Ray rScene(Point3f(x, 0, LensFrontZ() + 1), Vector3f(0, 0, -1));
    Ray rFilm;
    if (!TraceLensesFromScene(rScene, &rFilm))
        ErrorExit("Unable to trace ray from scene to film for thick lens "
                  "approximation. Is aperture stop extremely small?");
    ComputeCardinalPoints(rScene, rFilm, &pz[0], &fz[0]);

    // Compute cardinal points for scene side of lens system
    rFilm = Ray(Point3f(x, 0, LensRearZ() - 1), Vector3f(0, 0, 1));
    if (TraceLensesFromFilm(rFilm, &rScene) == 0)
        ErrorExit("Unable to trace ray from film to scene for thick lens "
                  "approximation. Is aperture stop extremely small?");
    ComputeCardinalPoints(rFilm, rScene, &pz[1], &fz[1]);
}